

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

void Curl_cwriter_remove_by_name(Curl_easy *data,char *name)

{
  Curl_cwriter *pCVar1;
  int iVar2;
  Curl_cwriter **ppCVar3;
  Curl_cwriter *w;
  
  ppCVar3 = &(data->req).writer_stack;
  while (pCVar1 = *ppCVar3, pCVar1 != (Curl_cwriter *)0x0) {
    iVar2 = strcmp(name,pCVar1->cwt->name);
    if (iVar2 == 0) {
      *ppCVar3 = pCVar1->next;
      (*pCVar1->cwt->do_close)(data,pCVar1);
      (*Curl_cfree)(pCVar1);
    }
    else {
      ppCVar3 = &pCVar1->next;
    }
  }
  return;
}

Assistant:

void Curl_cwriter_remove_by_name(struct Curl_easy *data,
                                 const char *name)
{
  struct Curl_cwriter **anchor = &data->req.writer_stack;

  while(*anchor) {
    if(!strcmp(name, (*anchor)->cwt->name)) {
      struct Curl_cwriter *w = (*anchor);
      *anchor = w->next;
      Curl_cwriter_free(data, w);
      continue;
    }
    anchor = &((*anchor)->next);
  }
}